

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase32::run(TestCase32 *this)

{
  char **this_00;
  bool bVar1;
  char *begin;
  char *end;
  bool local_e5;
  bool local_e4;
  Maybe<char> local_e3;
  bool local_e1;
  undefined1 local_e0 [3];
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  bool _kj_shouldLog_5;
  char local_c2;
  bool local_c1;
  char *pcStack_c0;
  bool _kj_shouldLog_4;
  char *c_2;
  undefined1 local_b0 [7];
  bool _kj_shouldLog_3;
  char local_92;
  bool local_91;
  char *pcStack_90;
  bool _kj_shouldLog_2;
  char *c_1;
  undefined1 local_80 [7];
  bool _kj_shouldLog_1;
  char local_62;
  bool local_61;
  char *pcStack_60;
  bool _kj_shouldLog;
  char *c;
  Maybe<char> local_43;
  undefined1 local_41 [6];
  Maybe<char> result;
  Any_ parser;
  Input input;
  StringPtr text;
  TestCase32 *this_local;
  
  this_00 = &input.best;
  StringPtr::StringPtr((StringPtr *)this_00,"foo");
  begin = StringPtr::begin((StringPtr *)this_00);
  end = StringPtr::end((StringPtr *)this_00);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_41 + 1),begin,end);
  local_41[0] = 0;
  Any_::operator()((Any_ *)&local_43,(IteratorInput<char,_const_char_*> *)local_41);
  pcStack_60 = kj::_::readMaybe<char>(&local_43);
  if (pcStack_60 == (char *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x29);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_80,(char (*) [24])"Expected \'c\', got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_80);
  }
  else if (*pcStack_60 != 'f') {
    local_61 = kj::_::Debug::shouldLog(ERROR);
    while (local_61 != false) {
      local_62 = 'f';
      kj::_::Debug::log<char_const(&)[31],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x27,ERROR,"\"failed: expected \" \"(\'f\') == (*c)\", \'f\', *c",
                 (char (*) [31])"failed: expected (\'f\') == (*c)",&local_62,pcStack_60);
      local_61 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)(local_41 + 1));
  if (bVar1) {
    c_1._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)c_1._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x2b,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      c_1._7_1_ = false;
    }
  }
  Any_::operator()((Any_ *)((long)&c_1 + 5),(IteratorInput<char,_const_char_*> *)local_41);
  Maybe<char>::operator=(&local_43,(Maybe<char> *)((long)&c_1 + 5));
  Maybe<char>::~Maybe((Maybe<char> *)((long)&c_1 + 5));
  pcStack_90 = kj::_::readMaybe<char>(&local_43);
  if (pcStack_90 == (char *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x31);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_b0,(char (*) [24])"Expected \'o\', got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_b0);
  }
  else if (*pcStack_90 != 'o') {
    local_91 = kj::_::Debug::shouldLog(ERROR);
    while (local_91 != false) {
      local_92 = 'o';
      kj::_::Debug::log<char_const(&)[31],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x2f,ERROR,"\"failed: expected \" \"(\'o\') == (*c)\", \'o\', *c",
                 (char (*) [31])"failed: expected (\'o\') == (*c)",&local_92,pcStack_90);
      local_91 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)(local_41 + 1));
  if (bVar1) {
    c_2._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)c_2._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x33,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      c_2._7_1_ = false;
    }
  }
  Any_::operator()((Any_ *)((long)&c_2 + 5),(IteratorInput<char,_const_char_*> *)local_41);
  Maybe<char>::operator=(&local_43,(Maybe<char> *)((long)&c_2 + 5));
  Maybe<char>::~Maybe((Maybe<char> *)((long)&c_2 + 5));
  pcStack_c0 = kj::_::readMaybe<char>(&local_43);
  if (pcStack_c0 == (char *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x39);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_e0,(char (*) [24])"Expected \'o\', got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_e0);
  }
  else if (*pcStack_c0 != 'o') {
    local_c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_c1 != false) {
      local_c2 = 'o';
      kj::_::Debug::log<char_const(&)[31],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x37,ERROR,"\"failed: expected \" \"(\'o\') == (*c)\", \'o\', *c",
                 (char (*) [31])"failed: expected (\'o\') == (*c)",&local_c2,pcStack_c0);
      local_c1 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)(local_41 + 1));
  if (!bVar1) {
    local_e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_e1 != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x3b,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_e1 = false;
    }
  }
  Any_::operator()((Any_ *)&local_e3,(IteratorInput<char,_const_char_*> *)local_41);
  Maybe<char>::operator=(&local_43,&local_e3);
  Maybe<char>::~Maybe(&local_e3);
  bVar1 = Maybe<char>::operator==(&local_43,(void *)0x0);
  if (!bVar1) {
    local_e4 = kj::_::Debug::shouldLog(ERROR);
    while (local_e4 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"result == nullptr\"",
                 (char (*) [35])"failed: expected result == nullptr");
      local_e4 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)(local_41 + 1));
  if (!bVar1) {
    local_e5 = kj::_::Debug::shouldLog(ERROR);
    while (local_e5 != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x3f,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_e5 = false;
    }
  }
  Maybe<char>::~Maybe(&local_43);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_41 + 1));
  return;
}

Assistant:

TEST(CommonParsers, AnyParser) {
  StringPtr text = "foo";
  Input input(text.begin(), text.end());
  constexpr auto parser = any;

  Maybe<char> result = parser(input);
  KJ_IF_MAYBE(c, result) {
    EXPECT_EQ('f', *c);
  } else {
    ADD_FAILURE() << "Expected 'c', got null.";
  }